

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wait.c
# Opt level: O1

int nsync_wait_n(void *mu,_func_void_void_ptr *lock,_func_void_void_ptr *unlock,
                nsync_time abs_deadline,int count,nsync_waitable_s **waitable)

{
  nsync_time b;
  ulong uVar1;
  int iVar2;
  waiter *w;
  nsync_waiter_s *__ptr;
  int iVar3;
  nsync_waiter_s *pnVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  bool bVar8;
  nsync_time nVar9;
  nsync_waiter_s nw_set [4];
  nsync_waiter_s local_118 [4];
  
  bVar8 = count == 0;
  if (bVar8) {
    uVar7 = 0;
  }
  else {
    uVar7 = 0;
    nVar9 = (*(*waitable)->funcs->ready_time)((*waitable)->v,(nsync_waiter_s *)0x0);
    iVar2 = nsync_time_cmp(nVar9,(nsync_time)ZEXT816((ulong)0));
    if (0 < iVar2) {
      uVar7 = 0;
      do {
        bVar8 = (ulong)(uint)count - 1 == uVar7;
        if (bVar8) {
          uVar7 = (ulong)((int)uVar7 + 1);
          goto LAB_00106686;
        }
        nVar9 = (*waitable[uVar7 + 1]->funcs->ready_time)
                          (waitable[uVar7 + 1]->v,(nsync_waiter_s *)0x0);
        iVar2 = nsync_time_cmp(nVar9,(nsync_time)ZEXT816((ulong)0));
        uVar7 = uVar7 + 1;
      } while (0 < iVar2);
    }
    if (!bVar8) {
      return (int)uVar7;
    }
  }
LAB_00106686:
  iVar2 = nsync_time_cmp(abs_deadline,(nsync_time)ZEXT816((ulong)0));
  iVar3 = (int)uVar7;
  if (0 < iVar2) {
    w = nsync_waiter_new_();
    if (count < 5) {
      __ptr = local_118;
    }
    else {
      __ptr = (nsync_waiter_s *)malloc((ulong)(uint)count * 0x38);
    }
    if (count == 0) {
      uVar6 = 0;
    }
    else {
      pnVar4 = __ptr;
      uVar5 = 0;
      do {
        pnVar4->tag = 0x726d2ba9;
        pnVar4->sem = &w->sem;
        nsync_dll_init_(&pnVar4->q,pnVar4);
        pnVar4->waiting = 0;
        pnVar4->flags = 0;
        iVar2 = (*waitable[uVar5]->funcs->enqueue)(waitable[uVar5]->v,pnVar4);
        uVar6 = uVar5 + 1;
        if ((ulong)(uint)count - 1 == uVar5) break;
        pnVar4 = pnVar4 + 1;
        uVar5 = uVar6;
      } while (iVar2 != 0);
    }
    bVar8 = true;
    if ((int)uVar6 == count) {
      bVar8 = mu == (void *)0x0;
      if (!bVar8) {
        (*unlock)(mu);
      }
      do {
        nVar9 = abs_deadline;
        if (count != 0) {
          uVar5 = 0;
          pnVar4 = __ptr;
          b = abs_deadline;
          do {
            nVar9 = (*waitable[uVar5]->funcs->ready_time)(waitable[uVar5]->v,pnVar4);
            iVar2 = nsync_time_cmp(nVar9,b);
            if (-1 < iVar2) {
              nVar9 = b;
            }
            uVar5 = uVar5 + 1;
            pnVar4 = pnVar4 + 1;
            b = nVar9;
          } while ((uint)count != uVar5);
        }
        iVar2 = nsync_time_cmp(nVar9,(nsync_time)ZEXT816((ulong)0));
      } while ((0 < iVar2) &&
              (iVar2 = nsync_mu_semaphore_p_with_deadline(&w->sem,nVar9), iVar2 == 0));
    }
    if ((int)uVar6 != 0) {
      uVar5 = 0;
      pnVar4 = __ptr;
      do {
        iVar2 = (*waitable[uVar5]->funcs->dequeue)(waitable[uVar5]->v,pnVar4);
        uVar1 = uVar5;
        if ((int)uVar7 != count || iVar2 != 0) {
          uVar1 = uVar7;
        }
        uVar7 = uVar1 & 0xffffffff;
        iVar3 = (int)uVar1;
        uVar5 = uVar5 + 1;
        pnVar4 = pnVar4 + 1;
      } while ((uVar6 & 0xffffffff) != uVar5);
    }
    if (__ptr != local_118) {
      free(__ptr);
    }
    nsync_waiter_free_(w);
    if (!bVar8) {
      (*lock)(mu);
    }
  }
  return iVar3;
}

Assistant:

NSYNC_CPP_START_

int nsync_wait_n (void *mu, void (*lock) (void *), void (*unlock) (void *),
		  nsync_time abs_deadline,
		  int count, struct nsync_waitable_s *waitable[]) {
	int ready;
	IGNORE_RACES_START ();
	for (ready = 0; ready != count &&
			nsync_time_cmp ((*waitable[ready]->funcs->ready_time) (
						waitable[ready]->v, NULL),
					nsync_time_zero) > 0;
	     ready++) {
	}
	if (ready == count && nsync_time_cmp (abs_deadline, nsync_time_zero) > 0) {
		int i;
		int unlocked = 0;
		int j;
		int enqueued = 1;
		waiter *w = nsync_waiter_new_ ();
		struct nsync_waiter_s nw_set[4];
		struct nsync_waiter_s *nw = nw_set;
		if (count > (int) (sizeof (nw_set) / sizeof (nw_set[0]))) {
			nw = (struct nsync_waiter_s *) malloc (count * sizeof (nw[0]));
		}
		for (i = 0; i != count && enqueued; i++) {
			nw[i].tag = NSYNC_WAITER_TAG;
			nw[i].sem = &w->sem;
			nsync_dll_init_ (&nw[i].q, &nw[i]);
			ATM_STORE (&nw[i].waiting, 0);
			nw[i].flags = 0;
			enqueued = (*waitable[i]->funcs->enqueue) (waitable[i]->v, &nw[i]);
		}

		if (i == count) {
			nsync_time min_ntime;
			if (mu != NULL) {
				(*unlock) (mu);
				unlocked = 1;
			}
			do {
				min_ntime = abs_deadline;
				for (j = 0; j != count; j++) {
					nsync_time ntime;
					ntime = (*waitable[j]->funcs->ready_time) (
						waitable[j]->v, &nw[j]);
					if (nsync_time_cmp (ntime, min_ntime) < 0) {
						min_ntime = ntime;
					}
				}
			} while (nsync_time_cmp (min_ntime, nsync_time_zero) > 0 &&
				 nsync_mu_semaphore_p_with_deadline (&w->sem,
					min_ntime) == 0);
		}

		/* An attempt was made above to enqueue waitable[0..i-1].
                   Dequeue any that are still enqueued, and remember the index
                   of the first ready (i.e., not still enqueued) object, if any.  */
		for (j = 0; j != i; j++) {
			int was_still_enqueued =
				(*waitable[j]->funcs->dequeue) (waitable[j]->v, &nw[j]);
			if (!was_still_enqueued && ready == count) {
				ready = j;
			}
		}

		if (nw != nw_set) {
			free (nw);
		}
		nsync_waiter_free_ (w);
		if (unlocked) {
			(*lock) (mu);
		}
	}
	IGNORE_RACES_END ();
	return (ready);
}